

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O1

void __thiscall
QCache<QtFontFallbacksCacheKey,_QList<QString>_>::trim
          (QCache<QtFontFallbacksCacheKey,_QList<QString>_> *this,qsizetype m)

{
  QCache<QtFontFallbacksCacheKey,_QList<QString>_> *__name;
  
  __name = (QCache<QtFontFallbacksCacheKey,_QList<QString>_> *)(this->chain).prev;
  while ((__name != this && (m < this->total))) {
    unlink(this,(char *)__name);
    __name = (QCache<QtFontFallbacksCacheKey,_QList<QString>_> *)(this->chain).prev;
  }
  return;
}

Assistant:

void trim(qsizetype m) noexcept(std::is_nothrow_destructible_v<Node>)
    {
        while (chain.prev != &chain && total > m) {
            Node *n = static_cast<Node *>(chain.prev);
            unlink(n);
        }
    }